

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

void re2::FactorAlternationImpl::Round2
               (Regexp **sub,int nsub,ParseFlags flags,
               vector<re2::Splice,_std::allocator<re2::Splice>_> *splices)

{
  bool bVar1;
  RegexpOp RVar2;
  int iVar3;
  int iVar4;
  Regexp **ppRVar5;
  Regexp *pRVar6;
  int local_5c;
  Regexp **local_58;
  int local_4c;
  Regexp *pRStack_48;
  int j;
  Regexp *prefix;
  Regexp *first_i;
  Regexp *pRStack_30;
  int i;
  Regexp *first;
  vector<re2::Splice,std::allocator<re2::Splice>> *pvStack_20;
  int start;
  vector<re2::Splice,_std::allocator<re2::Splice>_> *splices_local;
  ParseFlags flags_local;
  int nsub_local;
  Regexp **sub_local;
  
  first._4_4_ = 0;
  pRStack_30 = (Regexp *)0x0;
  first_i._4_4_ = 0;
  pvStack_20 = (vector<re2::Splice,std::allocator<re2::Splice>> *)splices;
  splices_local._0_4_ = flags;
  splices_local._4_4_ = nsub;
  _flags_local = sub;
  do {
    if (splices_local._4_4_ < first_i._4_4_) {
      return;
    }
    prefix = (Regexp *)0x0;
    if ((first_i._4_4_ < splices_local._4_4_) &&
       (prefix = Regexp::LeadingRegexp(_flags_local[first_i._4_4_]), pRStack_30 != (Regexp *)0x0)) {
      RVar2 = Regexp::op(pRStack_30);
      if ((((RVar2 != kRegexpBeginLine) &&
           ((((RVar2 = Regexp::op(pRStack_30), RVar2 != kRegexpEndLine &&
              (RVar2 = Regexp::op(pRStack_30), RVar2 != kRegexpWordBoundary)) &&
             (RVar2 = Regexp::op(pRStack_30), RVar2 != kRegexpNoWordBoundary)) &&
            ((RVar2 = Regexp::op(pRStack_30), RVar2 != kRegexpBeginText &&
             (RVar2 = Regexp::op(pRStack_30), RVar2 != kRegexpEndText)))))) &&
          (RVar2 = Regexp::op(pRStack_30), RVar2 != kRegexpCharClass)) &&
         ((RVar2 = Regexp::op(pRStack_30), RVar2 != kRegexpAnyChar &&
          (RVar2 = Regexp::op(pRStack_30), RVar2 != kRegexpAnyByte)))) {
        RVar2 = Regexp::op(pRStack_30);
        if (RVar2 == kRegexpRepeat) {
          iVar3 = Regexp::min(pRStack_30);
          iVar4 = Regexp::max(pRStack_30);
          if (iVar3 == iVar4) {
            ppRVar5 = Regexp::sub(pRStack_30);
            RVar2 = Regexp::op(*ppRVar5);
            if (RVar2 != kRegexpLiteral) {
              ppRVar5 = Regexp::sub(pRStack_30);
              RVar2 = Regexp::op(*ppRVar5);
              if (RVar2 != kRegexpCharClass) {
                ppRVar5 = Regexp::sub(pRStack_30);
                RVar2 = Regexp::op(*ppRVar5);
                if (RVar2 != kRegexpAnyChar) {
                  ppRVar5 = Regexp::sub(pRStack_30);
                  RVar2 = Regexp::op(*ppRVar5);
                  if (RVar2 != kRegexpAnyByte) goto LAB_00368cc0;
                }
              }
            }
            goto LAB_00368ca6;
          }
        }
        goto LAB_00368cc0;
      }
LAB_00368ca6:
      bVar1 = Regexp::Equal(pRStack_30,prefix);
      if (!bVar1) goto LAB_00368cc0;
    }
    else {
LAB_00368cc0:
      if ((first_i._4_4_ != first._4_4_) && (first_i._4_4_ != first._4_4_ + 1)) {
        pRStack_48 = Regexp::Incref(pRStack_30);
        for (local_4c = first._4_4_; local_4c < first_i._4_4_; local_4c = local_4c + 1) {
          pRVar6 = Regexp::RemoveLeadingRegexp(_flags_local[local_4c]);
          _flags_local[local_4c] = pRVar6;
        }
        local_58 = _flags_local + first._4_4_;
        local_5c = first_i._4_4_ - first._4_4_;
        std::vector<re2::Splice,std::allocator<re2::Splice>>::
        emplace_back<re2::Regexp*&,re2::Regexp**,int>
                  (pvStack_20,&stack0xffffffffffffffb8,&local_58,&local_5c);
      }
      if (first_i._4_4_ < splices_local._4_4_) {
        first._4_4_ = first_i._4_4_;
        pRStack_30 = prefix;
      }
    }
    first_i._4_4_ = first_i._4_4_ + 1;
  } while( true );
}

Assistant:

void FactorAlternationImpl::Round2(Regexp** sub, int nsub,
                                   Regexp::ParseFlags flags,
                                   std::vector<Splice>* splices) {
  // Round 2: Factor out common simple prefixes,
  // just the first piece of each concatenation.
  // This will be good enough a lot of the time.
  //
  // Complex subexpressions (e.g. involving quantifiers)
  // are not safe to factor because that collapses their
  // distinct paths through the automaton, which affects
  // correctness in some cases.
  int start = 0;
  Regexp* first = NULL;
  for (int i = 0; i <= nsub; i++) {
    // Invariant: sub[start:i] consists of regexps that all
    // begin with first.
    Regexp* first_i = NULL;
    if (i < nsub) {
      first_i = Regexp::LeadingRegexp(sub[i]);
      if (first != NULL &&
          // first must be an empty-width op
          // OR a char class, any char or any byte
          // OR a fixed repeat of a literal, char class, any char or any byte.
          (first->op() == kRegexpBeginLine ||
           first->op() == kRegexpEndLine ||
           first->op() == kRegexpWordBoundary ||
           first->op() == kRegexpNoWordBoundary ||
           first->op() == kRegexpBeginText ||
           first->op() == kRegexpEndText ||
           first->op() == kRegexpCharClass ||
           first->op() == kRegexpAnyChar ||
           first->op() == kRegexpAnyByte ||
           (first->op() == kRegexpRepeat &&
            first->min() == first->max() &&
            (first->sub()[0]->op() == kRegexpLiteral ||
             first->sub()[0]->op() == kRegexpCharClass ||
             first->sub()[0]->op() == kRegexpAnyChar ||
             first->sub()[0]->op() == kRegexpAnyByte))) &&
          Regexp::Equal(first, first_i))
        continue;
    }

    // Found end of a run with common leading regexp:
    // sub[start:i] all begin with first,
    // but sub[i] does not.
    if (i == start) {
      // Nothing to do - first iteration.
    } else if (i == start+1) {
      // Just one: don't bother factoring.
    } else {
      Regexp* prefix = first->Incref();
      for (int j = start; j < i; j++)
        sub[j] = Regexp::RemoveLeadingRegexp(sub[j]);
      splices->emplace_back(prefix, sub + start, i - start);
    }

    // Prepare for next iteration (if there is one).
    if (i < nsub) {
      start = i;
      first = first_i;
    }
  }
}